

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Peer.cpp
# Opt level: O2

ssize_t __thiscall Peer::read_abi_cxx11_(Peer *this,int __fd,void *__buf,size_t __nbytes)

{
  Socket __fd_00;
  int iVar1;
  ssize_t sVar2;
  Events *this_00;
  unique_ptr<Event,_std::default_delete<Event>_> *puVar3;
  Peers *this_01;
  long *plVar4;
  int *piVar5;
  char *__rhs;
  undefined4 in_register_00000034;
  Peer *args;
  allocator<char> local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  vector<char,_std::allocator<char>_> buf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  args = (Peer *)CONCAT44(in_register_00000034,__fd);
  std::vector<char,_std::allocator<char>_>::vector
            (&buf,(long)(int)__buf,(allocator_type *)&local_d8);
  __fd_00 = SocketResource::resource(&args->m_socket);
  sVar2 = recv(__fd_00,buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start,(long)(int)__buf,0x40);
  iVar1 = (int)sVar2;
  if (iVar1 == 0) {
    args->m_connected = false;
    this_00 = P2PSocket::events(args->m_master);
    puVar3 = Events::onPeerDisconnect(this_00);
    Event::trigger<Peer*>
              ((puVar3->_M_t).super___uniq_ptr_impl<Event,_std::default_delete<Event>_>._M_t.
               super__Tuple_impl<0UL,_Event_*,_std::default_delete<Event>_>.
               super__Head_base<0UL,_Event_*,_false>._M_head_impl,args);
    this_01 = P2PSocket::peers(args->m_master);
    Peers::remove(this_01,(char *)args);
    this->m_master = (P2PSocket *)&(this->m_name)._M_string_length;
    (this->m_name)._M_dataplus._M_p = (pointer)0x0;
    *(undefined1 *)&(this->m_name)._M_string_length = 0;
  }
  else {
    if (iVar1 == -1) {
      plVar4 = (long *)__cxa_allocate_exception(0x20);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a0,"Failed to read peer ",&local_d9);
      std::operator+(&local_80,&local_a0,&args->m_name);
      std::operator+(&local_60,&local_80," ");
      piVar5 = __errno_location();
      __rhs = strerror(*piVar5);
      std::operator+(&local_40,&local_60,__rhs);
      std::operator+(&local_d8,&local_40,"\n");
      *plVar4 = (long)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p == &local_d8.field_2) {
        *(undefined4 *)(plVar4 + 2) = local_d8.field_2._M_allocated_capacity._0_4_;
        *(undefined4 *)((long)plVar4 + 0x14) = local_d8.field_2._M_allocated_capacity._4_4_;
        *(undefined4 *)(plVar4 + 3) = local_d8.field_2._8_4_;
        *(undefined4 *)((long)plVar4 + 0x1c) = local_d8.field_2._12_4_;
      }
      else {
        *plVar4 = (long)local_d8._M_dataplus._M_p;
        plVar4[2] = CONCAT44(local_d8.field_2._M_allocated_capacity._4_4_,
                             local_d8.field_2._M_allocated_capacity._0_4_);
      }
      plVar4[1] = local_d8._M_string_length;
      local_d8._M_string_length = 0;
      local_d8.field_2._M_allocated_capacity._0_4_ =
           local_d8.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      __cxa_throw(plVar4,&PeerException::typeinfo,PeerException::~PeerException);
    }
    std::vector<char,_std::allocator<char>_>::resize(&buf,(long)iVar1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)this,
               buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
               _M_start,(allocator<char> *)&local_d8);
  }
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&buf.super__Vector_base<char,_std::allocator<char>_>);
  return (ssize_t)this;
}

Assistant:

std::string Peer::read(const int length)
{
    std::vector<char> buf(length);
    int recv = ::recv(m_socket.resource(), &buf[0], length, MSG_DONTWAIT);
    if (recv == -1) {
        throw PeerException(std::string{"Failed to read peer "} + m_name + " " +
                            std::strerror(errno) + "\n");
    }
    if (recv == 0) {
        // Connection is no longer valid, remote has been disconnected
        m_connected = false;
        this->m_master->events()->onPeerDisconnect()->trigger(this);
        this->m_master->peers()->remove(this);
        return std::string{};
    }
    buf.resize(recv);
    return std::string{buf.data()};
}